

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  Rtree *pRtree;
  sqlite3_str *p;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  sqlite3_uint64 n;
  
  if (argc - 0x68U < 0xffffff9e) {
    pcVar6 = "Too few columns for an rtree table";
    if (5 < argc) {
      pcVar6 = "Too many columns for an rtree table";
    }
    pcVar6 = sqlite3_mprintf("%s",pcVar6);
    *pzErr = pcVar6;
    return 1;
  }
  sqlite3_vtab_config(db,1);
  sqlite3_vtab_config(db,2);
  sVar4 = strlen(argv[1]);
  sVar5 = strlen(argv[2]);
  iVar3 = (int)sVar5;
  n = (long)(int)sVar4 + (long)(iVar3 * 2) + 0x3d0;
  pRtree = (Rtree *)sqlite3_malloc64(n);
  if (pRtree == (Rtree *)0x0) {
    return 7;
  }
  memset(pRtree,0,n);
  pcVar6 = (char *)((long)&pRtree[1].base.pModule + ((long)((sVar4 << 0x20) + 0x100000000) >> 0x20))
  ;
  pRtree->nBusy = 1;
  (pRtree->base).pModule = &rtreeModule;
  pRtree->zDb = (char *)(pRtree + 1);
  pRtree->zName = pcVar6;
  pRtree->zNodeName = pcVar6 + (iVar3 + 1);
  pRtree->eCoordType = pAux != (void *)0x0;
  memcpy(pRtree + 1,argv[1],(long)(int)sVar4);
  sVar4 = (size_t)iVar3;
  memcpy(pcVar6,argv[2],sVar4);
  memcpy(pRtree->zNodeName,argv[2],sVar4);
  builtin_strncpy(pRtree->zNodeName + sVar4,"_node",6);
  p = sqlite3_str_new(db);
  pcVar6 = argv[3];
  uVar2 = rtreeTokenLength(pcVar6);
  sqlite3_str_appendf(p,"CREATE TABLE x(%.*s INT",(ulong)uVar2,pcVar6);
  for (uVar8 = 4; (uint)argc != uVar8; uVar8 = uVar8 + 1) {
    pcVar6 = argv[uVar8];
    if (*pcVar6 == '+') {
      pRtree->nAux = pRtree->nAux + '\x01';
      pcVar6 = pcVar6 + 1;
      uVar2 = rtreeTokenLength(pcVar6);
      pcVar7 = ",%.*s";
    }
    else {
      if (pRtree->nAux != '\0') break;
      pRtree->nDim2 = pRtree->nDim2 + '\x01';
      pcVar7 = (char *)((long)&rtreeInit_azFormat_rel +
                       (long)*(int *)((long)&rtreeInit_azFormat_rel +
                                     (ulong)(pAux != (void *)0x0) * 4));
      uVar2 = rtreeTokenLength(pcVar6);
    }
    sqlite3_str_appendf(p,pcVar7,(ulong)uVar2,pcVar6);
  }
  sqlite3_str_appendf(p,");");
  pcVar6 = sqlite3_str_finish(p);
  if (pcVar6 == (char *)0x0) {
    iVar3 = 7;
  }
  else {
    if (uVar8 < (uint)argc) {
      pcVar7 = sqlite3_mprintf("%s","Auxiliary rtree columns must be last");
      iVar3 = 1;
    }
    else {
      iVar3 = sqlite3_declare_vtab(db,pcVar6);
      if (iVar3 == 0) {
        iVar3 = 0;
        goto LAB_001da0f8;
      }
      pcVar7 = sqlite3_errmsg(db);
      pcVar7 = sqlite3_mprintf("%s",pcVar7);
    }
    *pzErr = pcVar7;
  }
LAB_001da0f8:
  sqlite3_free(pcVar6);
  if (iVar3 != 0) goto LAB_001da1a8;
  bVar1 = pRtree->nDim2;
  pRtree->nDim = bVar1 >> 1;
  if (bVar1 < 2) {
    pcVar6 = "Too few columns for an rtree table";
LAB_001da195:
    iVar3 = 0;
  }
  else {
    if (10 < bVar1) {
      pcVar6 = "Too many columns for an rtree table";
      goto LAB_001da195;
    }
    if ((bVar1 & 1) != 0) {
      pcVar6 = "Wrong number of columns for an rtree table";
      goto LAB_001da195;
    }
    pRtree->nBytesPerCell = bVar1 * '\x04' + '\b';
    iVar3 = getNodeSize(db,pRtree,isCreate,pzErr);
    if (iVar3 != 0) goto LAB_001da1a8;
    iVar3 = rtreeSqlInit(pRtree,db,argv[1],argv[2],isCreate);
    if (iVar3 == 0) {
      *ppVtab = (sqlite3_vtab *)pRtree;
      return 0;
    }
    pcVar6 = sqlite3_errmsg(db);
  }
  pcVar6 = sqlite3_mprintf("%s",pcVar6);
  *pzErr = pcVar6;
LAB_001da1a8:
  rtreeRelease(pRtree);
  return iVar3 + (uint)(iVar3 == 0);
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc<6 || argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[2 + (argc>=6)]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
  sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);


  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName*2+8);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName*2+8);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->zNodeName = &pRtree->zName[nName+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);
  memcpy(pRtree->zNodeName, argv[2], nName);
  memcpy(&pRtree->zNodeName[nName], "_node", 6);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%.*s INT",
                      rtreeTokenLength(argv[3]), argv[3]);
  for(ii=4; ii<argc; ii++){
    const char *zArg = argv[ii];
    if( zArg[0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%.*s", rtreeTokenLength(zArg+1), zArg+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      static const char *azFormat[] = {",%.*s REAL", ",%.*s INT"};
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, azFormat[eCoordType],
                          rtreeTokenLength(zArg), zArg);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}